

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O1

void __thiscall
QProgressDialogPrivate::setCancelButtonText(QProgressDialogPrivate *this,QString *cancelButtonText)

{
  QWidget *parent;
  QPushButton *this_00;
  
  parent = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  if ((cancelButtonText->d).ptr == (char16_t *)0x0) {
    this_00 = (QPushButton *)0x0;
  }
  else {
    if (this->cancel != (QPushButton *)0x0) {
      QAbstractButton::setText(&this->cancel->super_QAbstractButton,cancelButtonText);
      goto LAB_005115a2;
    }
    this_00 = (QPushButton *)operator_new(0x28);
    QPushButton::QPushButton(this_00,cancelButtonText,parent);
  }
  QProgressDialog::setCancelButton((QProgressDialog *)parent,this_00);
LAB_005115a2:
  ensureSizeIsAtLeastSizeHint(this);
  return;
}

Assistant:

void QProgressDialogPrivate::setCancelButtonText(const QString &cancelButtonText)
{
    Q_Q(QProgressDialog);

    if (!cancelButtonText.isNull()) {
        if (cancel) {
            cancel->setText(cancelButtonText);
        } else {
            q->setCancelButton(new QPushButton(cancelButtonText, q));
        }
    } else {
        q->setCancelButton(nullptr);
    }
    ensureSizeIsAtLeastSizeHint();
}